

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O1

void ui_enter_init(game_event_type type,game_event_data *data,void *user)

{
  _Bool _Var1;
  ang_file *f;
  char *buf_00;
  char buf [1024];
  char why [1024];
  char acStack_838 [1024];
  char local_438 [1032];
  
  path_build(acStack_838,0x400,ANGBAND_DIR_SCREENS,"news.txt");
  _Var1 = file_exists(acStack_838);
  if (!_Var1) {
    strnfmt(local_438,0x400,"Cannot access the \'%s\' file!",acStack_838);
    quit_fmt("%s\n\n%s",local_438,
             "The \'lib\' directory is probably missing or broken.\nPerhaps the archive was not extracted correctly.\nSee the \'readme.txt\' file for more information."
            );
  }
  Term_clear();
  path_build(acStack_838,0x400,ANGBAND_DIR_SCREENS,"news.txt");
  f = file_open(acStack_838,MODE_READ,FTYPE_TEXT);
  text_out_hook = text_out_to_screen;
  if (f != (ang_file *)0x0) {
    text_out_indent = (Term->wid - (Term->wid + -0x50 >> 0x1f)) + -0x50 >> 1;
    Term_gotoxy(L'\0',(Term->hgt + -0x17) / 5);
    _Var1 = file_getl(f,acStack_838,0x400);
    if (_Var1) {
      do {
        buf_00 = strstr(acStack_838,"$VERSION");
        if (buf_00 != (char *)0x0) {
          strnfmt(buf_00,(size_t)(local_438 + -(long)buf_00),"%-8s",buildver);
        }
        text_out_e("%s",acStack_838);
        text_out("\n");
        _Var1 = file_getl(f,acStack_838,0x400);
      } while (_Var1);
    }
    text_out_indent = L'\0';
    file_close(f);
  }
  Term_fresh();
  event_add_handler(EVENT_INITSTATUS,splashscreen_note,(void *)0x0);
  return;
}

Assistant:

static void show_splashscreen(game_event_type type, game_event_data *data,
							  void *user)
{
	ang_file *fp;

	char buf[1024];

	/* Verify the "news" file */
	path_build(buf, sizeof(buf), ANGBAND_DIR_SCREENS, "news.txt");
	if (!file_exists(buf)) {
		char why[1024];

		/* Crash and burn */
		strnfmt(why, sizeof(why), "Cannot access the '%s' file!", buf);
		init_angband_aux(why);
	}


	/* Prepare to display the "news" file */
	Term_clear();

	/* Open the News file */
	path_build(buf, sizeof(buf), ANGBAND_DIR_SCREENS, "news.txt");
	fp = file_open(buf, MODE_READ, FTYPE_TEXT);

	text_out_hook = text_out_to_screen;

	/* Dump */
	if (fp) {
		/* Centre the splashscreen - assume news.txt has width 80, height 23 */
		text_out_indent = (Term->wid - 80) / 2;
		Term_gotoxy(0, (Term->hgt - 23) / 5);

		/* Dump the file to the screen */
		while (file_getl(fp, buf, sizeof(buf))) {
			char *version_marker = strstr(buf, "$VERSION");
			if (version_marker) {
				ptrdiff_t pos = version_marker - buf;
				strnfmt(version_marker, sizeof(buf) - pos, "%-8s", buildver);
			}

			text_out_e("%s", buf);
			text_out("\n");
		}

		text_out_indent = 0;
		file_close(fp);
	}

	/* Flush it */
	Term_fresh();
}